

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# superlu.c
# Opt level: O0

int main(int argc,char **argv)

{
  char local_7d8 [8];
  char msg_5 [256];
  char msg_4 [256];
  int local_5cc;
  char local_5c8 [4];
  int i;
  char msg_3 [256];
  char msg_2 [256];
  char msg_1 [256];
  char msg [256];
  SuperLUStat_t stat;
  superlu_options_t options;
  int_t local_108;
  int_t nnz;
  int_t info;
  int n;
  int m;
  int nrhs;
  int *perm_c;
  int *perm_r;
  int_t *xa;
  int_t *asub;
  double l;
  double r;
  double e;
  double p;
  double u;
  double s;
  double *rhs;
  double *a;
  SuperMatrix B;
  SuperMatrix U;
  SuperMatrix L;
  SuperMatrix A;
  char **argv_local;
  int argc_local;
  
  nnz = 5;
  info = 5;
  rhs = doubleMalloc(0xc);
  if (rhs == (double *)0x0) {
    sprintf(msg_1 + 0xf8,"%s at line %d in file %s\n","Malloc fails for a[].",0x2e,
            "/workspace/llm4binary/github/license_c_cmakelists/xiaoyeli[P]superlu/EXAMPLE/superlu.c"
           );
    superlu_abort_and_exit(msg_1 + 0xf8);
  }
  xa = intMalloc(0xc);
  if (xa == (int_t *)0x0) {
    sprintf(msg_2 + 0xf8,"%s at line %d in file %s\n","Malloc fails for asub[].",0x2f,
            "/workspace/llm4binary/github/license_c_cmakelists/xiaoyeli[P]superlu/EXAMPLE/superlu.c"
           );
    superlu_abort_and_exit(msg_2 + 0xf8);
  }
  perm_r = intMalloc(nnz + 1);
  if (perm_r == (int_t *)0x0) {
    sprintf(msg_3 + 0xf8,"%s at line %d in file %s\n","Malloc fails for xa[].",0x30,
            "/workspace/llm4binary/github/license_c_cmakelists/xiaoyeli[P]superlu/EXAMPLE/superlu.c"
           );
    superlu_abort_and_exit(msg_3 + 0xf8);
  }
  u = 19.0;
  p = 21.0;
  e = 16.0;
  r = 5.0;
  l = 18.0;
  asub = (int_t *)0x4028000000000000;
  *rhs = 19.0;
  rhs[1] = 12.0;
  rhs[2] = 12.0;
  rhs[3] = 21.0;
  rhs[4] = 12.0;
  rhs[5] = 12.0;
  rhs[6] = 21.0;
  rhs[7] = 16.0;
  rhs[8] = 21.0;
  rhs[9] = 5.0;
  rhs[10] = 21.0;
  rhs[0xb] = 18.0;
  *xa = 0;
  xa[1] = 1;
  xa[2] = 4;
  xa[3] = 1;
  xa[4] = 2;
  xa[5] = 4;
  xa[6] = 0;
  xa[7] = 2;
  xa[8] = 0;
  xa[9] = 3;
  xa[10] = 3;
  xa[0xb] = 4;
  *perm_r = 0;
  perm_r[1] = 3;
  perm_r[2] = 6;
  perm_r[3] = 8;
  perm_r[4] = 10;
  perm_r[5] = 0xc;
  dCreate_CompCol_Matrix((SuperMatrix *)&L.Store,info,nnz,0xc,rhs,xa,perm_r,SLU_NC,SLU_D,SLU_GE);
  n = 1;
  s = (double)doubleMalloc((long)info);
  if ((double *)s == (double *)0x0) {
    sprintf(local_5c8,"%s at line %d in file %s\n","Malloc fails for rhs[].",0x3e,
            "/workspace/llm4binary/github/license_c_cmakelists/xiaoyeli[P]superlu/EXAMPLE/superlu.c"
           );
    superlu_abort_and_exit(local_5c8);
  }
  for (local_5cc = 0; local_5cc < info; local_5cc = local_5cc + 1) {
    *(undefined8 *)((long)s + (long)local_5cc * 8) = 0x3ff0000000000000;
  }
  dCreate_Dense_Matrix((SuperMatrix *)&a,info,n,(double *)s,info,SLU_DN,SLU_D,SLU_GE);
  perm_c = int32Malloc(info);
  if (perm_c == (int *)0x0) {
    sprintf(msg_5 + 0xf8,"%s at line %d in file %s\n","Malloc fails for perm_r[].",0x43,
            "/workspace/llm4binary/github/license_c_cmakelists/xiaoyeli[P]superlu/EXAMPLE/superlu.c"
           );
    superlu_abort_and_exit(msg_5 + 0xf8);
  }
  _m = int32Malloc(nnz);
  if (_m == (int *)0x0) {
    sprintf(local_7d8,"%s at line %d in file %s\n","Malloc fails for perm_c[].",0x44,
            "/workspace/llm4binary/github/license_c_cmakelists/xiaoyeli[P]superlu/EXAMPLE/superlu.c"
           );
    superlu_abort_and_exit(local_7d8);
  }
  set_default_options((superlu_options_t *)&stat.expansions);
  StatInit((SuperLUStat_t *)(msg + 0xf8));
  dgssv((superlu_options_t *)&stat.expansions,(SuperMatrix *)&L.Store,_m,perm_c,
        (SuperMatrix *)&U.Store,(SuperMatrix *)&B.Store,(SuperMatrix *)&a,
        (SuperLUStat_t *)(msg + 0xf8),&local_108);
  dPrint_CompCol_Matrix("A",(SuperMatrix *)&L.Store);
  dPrint_CompCol_Matrix("U",(SuperMatrix *)&B.Store);
  dPrint_SuperNode_Matrix("L",(SuperMatrix *)&U.Store);
  print_int_vec("\nperm_r",info,perm_c);
  superlu_free((void *)s);
  superlu_free(perm_c);
  superlu_free(_m);
  Destroy_CompCol_Matrix((SuperMatrix *)&L.Store);
  Destroy_SuperMatrix_Store((SuperMatrix *)&a);
  Destroy_SuperNode_Matrix((SuperMatrix *)&U.Store);
  Destroy_CompCol_Matrix((SuperMatrix *)&B.Store);
  StatFree((SuperLUStat_t *)(msg + 0xf8));
  return 0;
}

Assistant:

int main(int argc, char *argv[])
{
    SuperMatrix A, L, U, B;
    double   *a, *rhs;
    double   s, u, p, e, r, l;
    int_t    *asub, *xa;
    int      *perm_r; /* row permutations from partial pivoting */
    int      *perm_c; /* column permutation vector */
    int      nrhs, m, n;
    int_t    info, nnz;
    superlu_options_t options;
    SuperLUStat_t stat;

    /* Initialize matrix A. */
    m = n = 5;
    nnz = 12;
    if ( !(a = doubleMalloc(nnz)) ) ABORT("Malloc fails for a[].");
    if ( !(asub = intMalloc(nnz)) ) ABORT("Malloc fails for asub[].");
    if ( !(xa = intMalloc(n+1)) ) ABORT("Malloc fails for xa[].");
    s = 19.0; u = 21.0; p = 16.0; e = 5.0; r = 18.0; l = 12.0;
    a[0] = s; a[1] = l; a[2] = l; a[3] = u; a[4] = l; a[5] = l;
    a[6] = u; a[7] = p; a[8] = u; a[9] = e; a[10]= u; a[11]= r;
    asub[0] = 0; asub[1] = 1; asub[2] = 4; asub[3] = 1;
    asub[4] = 2; asub[5] = 4; asub[6] = 0; asub[7] = 2;
    asub[8] = 0; asub[9] = 3; asub[10]= 3; asub[11]= 4;
    xa[0] = 0; xa[1] = 3; xa[2] = 6; xa[3] = 8; xa[4] = 10; xa[5] = 12;

    /* Create matrix A in the format expected by SuperLU. */
    dCreate_CompCol_Matrix(&A, m, n, nnz, a, asub, xa, SLU_NC, SLU_D, SLU_GE);
    
    /* Create right-hand side matrix B. */
    nrhs = 1;
    if ( !(rhs = doubleMalloc(m * nrhs)) ) ABORT("Malloc fails for rhs[].");
    for (int i = 0; i < m; ++i)
        rhs[i] = 1.0;
    dCreate_Dense_Matrix(&B, m, nrhs, rhs, m, SLU_DN, SLU_D, SLU_GE);

    if ( !(perm_r = int32Malloc(m)) ) ABORT("Malloc fails for perm_r[].");
    if ( !(perm_c = int32Malloc(n)) ) ABORT("Malloc fails for perm_c[].");

    /* Set the default input options. */
    set_default_options(&options);
    options.ColPerm = NATURAL;

    /* Initialize the statistics variables. */
    StatInit(&stat);

    /* Solve the linear system. */
    dgssv(&options, &A, perm_c, perm_r, &L, &U, &B, &stat, &info);
    
    dPrint_CompCol_Matrix("A", &A);
    dPrint_CompCol_Matrix("U", &U);
    dPrint_SuperNode_Matrix("L", &L);
    print_int_vec("\nperm_r", m, perm_r);

    /* De-allocate storage */
    SUPERLU_FREE (rhs);
    SUPERLU_FREE (perm_r);
    SUPERLU_FREE (perm_c);
    Destroy_CompCol_Matrix(&A);
    Destroy_SuperMatrix_Store(&B);
    Destroy_SuperNode_Matrix(&L);
    Destroy_CompCol_Matrix(&U);
    StatFree(&stat);

    return EXIT_SUCCESS;
}